

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_clock.cc
# Opt level: O3

QuicTime __thiscall
quic::QuicClock::ConvertWallTimeToQuicTime(QuicClock *this,QuicWallTime *walltime)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Delta delta;
  int64_t iVar4;
  QuicWallTime local_28;
  QuicWallTime local_20;
  
  if (this->is_calibrated_ == true) {
    uVar3 = QuicWallTime::ToUNIXMicroseconds(walltime);
    iVar4 = uVar3 - (this->calibration_offset_).time_offset_;
  }
  else {
    iVar1 = (*this->_vptr_QuicClock[3])(this);
    iVar2 = (*this->_vptr_QuicClock[4])(this);
    local_28.microseconds_ = CONCAT44(extraout_var_00,iVar2);
    delta.time_offset_ = QuicWallTime::ToUNIXMicroseconds(walltime);
    local_20 = QuicWallTime::Subtract(&local_28,delta);
    uVar3 = QuicWallTime::ToUNIXMicroseconds(&local_20);
    iVar4 = CONCAT44(extraout_var,iVar1) - uVar3;
  }
  return (QuicTime)iVar4;
}

Assistant:

QuicTime QuicClock::ConvertWallTimeToQuicTime(
		const QuicWallTime& walltime) const {
		if (is_calibrated_) {
			int64_t time_in_us = static_cast<int64_t>(walltime.ToUNIXMicroseconds()) -
				calibration_offset_.ToMicroseconds();
			return QuicTime::Zero() + QuicTime::Delta::FromMicroseconds(time_in_us);
		}

		//     ..........................
		//     |            |           |
		// unix epoch   |walltime|   WallNow()
		//     ..........................
		//            |     |           |
		//     clock epoch  |         Now()
		//               result
		//
		// result = Now() - (WallNow() - walltime)
		return Now() - QuicTime::Delta::FromMicroseconds(
			WallNow()
			.Subtract(QuicTime::Delta::FromMicroseconds(
				walltime.ToUNIXMicroseconds()))
			.ToUNIXMicroseconds());
	}